

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

int64_t av1_haar_ac_sad_mxn_uint8_input
                  (uint8_t *input,int stride,int hbd,int num_8x8_rows,int num_8x8_cols)

{
  int iVar1;
  int r;
  long lVar2;
  tran_low_t *ptVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int64_t iVar9;
  tran_low_t output [64];
  tran_low_t local_138 [66];
  
  if (num_8x8_rows < 1) {
    iVar9 = 0;
  }
  else {
    uVar4 = 0;
    iVar9 = 0;
    do {
      if (0 < num_8x8_cols) {
        uVar6 = 0;
        do {
          av1_fdwt8x8_uint8_input_c
                    (input + uVar6 * 8 + (long)(stride * 8 * (int)uVar4),local_138,stride,hbd);
          lVar2 = 0;
          uVar5 = 0;
          ptVar3 = local_138;
          do {
            lVar7 = 0;
            do {
              if ((((uint)lVar7 | (uint)lVar2) & 0xfffffffc) != 0) {
                iVar1 = ptVar3[lVar7];
                iVar8 = -iVar1;
                if (0 < iVar1) {
                  iVar8 = iVar1;
                }
                uVar5 = uVar5 + iVar8;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != 8);
            lVar2 = lVar2 + 1;
            ptVar3 = ptVar3 + 8;
          } while (lVar2 != 8);
          iVar9 = iVar9 + (ulong)uVar5;
          uVar6 = uVar6 + 1;
        } while (uVar6 != (uint)num_8x8_cols);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)num_8x8_rows);
  }
  return iVar9;
}

Assistant:

int64_t av1_haar_ac_sad_mxn_uint8_input(const uint8_t *input, int stride,
                                        int hbd, int num_8x8_rows,
                                        int num_8x8_cols) {
  int64_t wavelet_energy = 0;
  for (int r8 = 0; r8 < num_8x8_rows; ++r8) {
    for (int c8 = 0; c8 < num_8x8_cols; ++c8) {
      wavelet_energy += haar_ac_sad_8x8_uint8_input(
          input + c8 * 8 + r8 * 8 * stride, stride, hbd);
    }
  }
  return wavelet_energy;
}